

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decodeFrameHeader(ZSTD_DCtx *dctx,void *src,size_t headerSize)

{
  uint uVar1;
  long in_RDX;
  long in_RDI;
  size_t result;
  ZSTD_format_e in_stack_00000054;
  size_t in_stack_00000058;
  void *in_stack_00000060;
  ZSTD_frameHeader *in_stack_00000068;
  XXH64_hash_t in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar2;
  size_t local_8;
  
  local_8 = ZSTD_getFrameHeader_advanced
                      (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
  uVar1 = ZSTD_isError(0x289b68);
  if (uVar1 == 0) {
    if (local_8 == 0) {
      if ((*(int *)(in_RDI + 0x7610) == 1) && (*(long *)(in_RDI + 0x7608) != 0)) {
        ZSTD_DCtx_selectFrameDDict
                  ((ZSTD_DCtx *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      }
      if ((*(int *)(in_RDI + 0x7504) == 0) ||
         (*(int *)(in_RDI + 0x75f8) == *(int *)(in_RDI + 0x7504))) {
        bVar2 = 0;
        if (*(int *)(in_RDI + 0x7508) != 0) {
          bVar2 = *(int *)(in_RDI + 0x759c) != 0 ^ 0xff;
        }
        *(uint *)(in_RDI + 0x75a0) = (uint)((bVar2 & 1) != 0);
        if (*(int *)(in_RDI + 0x75a0) != 0) {
          XXH_INLINE_XXH64_reset
                    ((XXH_NAMESPACEXXH64_state_t *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
        }
        *(long *)(in_RDI + 0x7518) = in_RDX + *(long *)(in_RDI + 0x7518);
        local_8 = 0;
      }
      else {
        local_8 = 0xffffffffffffffe0;
      }
    }
    else {
      local_8 = 0xffffffffffffffb8;
    }
  }
  return local_8;
}

Assistant:

static size_t ZSTD_decodeFrameHeader(ZSTD_DCtx* dctx, const void* src, size_t headerSize)
{
    size_t const result = ZSTD_getFrameHeader_advanced(&(dctx->fParams), src, headerSize, dctx->format);
    if (ZSTD_isError(result)) return result;    /* invalid header */
    RETURN_ERROR_IF(result>0, srcSize_wrong, "headerSize too small");

    /* Reference DDict requested by frame if dctx references multiple ddicts */
    if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts && dctx->ddictSet) {
        ZSTD_DCtx_selectFrameDDict(dctx);
    }

#ifndef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /* Skip the dictID check in fuzzing mode, because it makes the search
     * harder.
     */
    RETURN_ERROR_IF(dctx->fParams.dictID && (dctx->dictID != dctx->fParams.dictID),
                    dictionary_wrong, "");
#endif
    dctx->validateChecksum = (dctx->fParams.checksumFlag && !dctx->forceIgnoreChecksum) ? 1 : 0;
    if (dctx->validateChecksum) XXH64_reset(&dctx->xxhState, 0);
    dctx->processedCSize += headerSize;
    return 0;
}